

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

int match_shaders(void *_a,void *_b,void *data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  iVar3 = 0;
  if (*_a != 0) {
    iVar3 = *(int *)(*_a + 8);
  }
  if (*_b != 0) {
    iVar2 = *(int *)(*_b + 8);
  }
  uVar1 = 0;
  if (iVar3 == iVar2) {
    iVar2 = 0;
    iVar3 = 0;
    if (*(long *)((long)_a + 8) != 0) {
      iVar3 = *(int *)(*(long *)((long)_a + 8) + 8);
    }
    if (*(long *)((long)_b + 8) != 0) {
      iVar2 = *(int *)(*(long *)((long)_b + 8) + 8);
    }
    uVar1 = (uint)(iVar3 == iVar2);
  }
  return uVar1;
}

Assistant:

static int match_shaders(const void *_a, const void *_b, void *data)
{
    (void) data;
    const BoundShaders *a = (const BoundShaders *) _a;
    const BoundShaders *b = (const BoundShaders *) _b;

    const GLuint av = (a->vertex) ? a->vertex->handle : 0;
    const GLuint bv = (b->vertex) ? b->vertex->handle : 0;
    if (av != bv)
        return 0;

    const GLuint af = (a->fragment) ? a->fragment->handle : 0;
    const GLuint bf = (b->fragment) ? b->fragment->handle : 0;
    if (af != bf)
        return 0;

    return 1;
}